

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O2

bool __thiscall indk::Neuron::doSignalSendEntry(Neuron *this,string *From,float X,int64_t tn)

{
  pointer ppVar1;
  __type _Var2;
  bool bVar3;
  Computer *pCVar4;
  pointer ppVar5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  *e;
  pointer ppVar6;
  
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (this->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    _Var2 = std::operator==(&ppVar6->first,From);
    if (_Var2) {
      Entry::doIn(ppVar6->second,X,tn);
      break;
    }
  }
  ppVar6 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppVar5 = ppVar1;
    if (ppVar5 == ppVar6) {
      pCVar4 = System::getComputeBackend();
      (*pCVar4->_vptr_Computer[3])(pCVar4,this);
      break;
    }
    bVar3 = Entry::doCheckState(ppVar5->second,tn);
    ppVar1 = ppVar5 + 1;
  } while (bVar3);
  return ppVar5 == ppVar6;
}

Assistant:

bool indk::Neuron::doSignalSendEntry(const std::string& From, float X, int64_t tn) {
    for (const auto &e: Entries) {
        if (e.first == From) {
            e.second -> doIn(X, tn);
            break;
        }
    }

    for (auto &e: Entries) {
        if (!e.second->doCheckState(tn)) {
//            std::cout << "In to entry of " << Name << " from " << From << " value " << X << " (" << tn << ") - not ready" << std::endl;
            return false;
        }
    }
//    std::cout << "In to entry of " << Name << " from " << From << " value " << X <<  " (" << tn << ") - ready" << std::endl;
    indk::System::getComputeBackend() -> doProcess((void*)this);
    return true;
}